

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteBuildDBTest.cpp
# Opt level: O3

void __thiscall
SQLiteBuildDBTest_ErrorHandling_Test::~SQLiteBuildDBTest_ErrorHandling_Test
          (SQLiteBuildDBTest_ErrorHandling_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SQLiteBuildDBTest, ErrorHandling) {
    // Create a temporary file.
    llvm::SmallString<256> dbPath;
    auto ec = llvm::sys::fs::createTemporaryFile("build", "db", dbPath);
    EXPECT_EQ(bool(ec), false);
    const char* path = dbPath.c_str();
    fprintf(stderr, "using db: %s\n", path);

    std::string error;
    std::unique_ptr<BuildDB> buildDB = createSQLiteBuildDB(dbPath, 1, /* recreateUnmatchedVersion = */ true, &error);
    EXPECT_TRUE(buildDB != nullptr);
    EXPECT_EQ(error, "");

    sqlite3 *db = nullptr;
    sqlite3_open(path, &db);
    sqlite3_exec(db, "PRAGMA locking_mode = EXCLUSIVE; BEGIN EXCLUSIVE;", nullptr, nullptr, nullptr);

    buildDB = createSQLiteBuildDB(dbPath, 1, /* recreateUnmatchedVersion = */ true, &error);
    EXPECT_FALSE(buildDB == nullptr);

    // The database is opened lazily, thus run an operation that will cause it
    // to be opened and verify that it fails as expected.
    bool result = true;
    buildDB->getCurrentEpoch(&result, &error);
    EXPECT_FALSE(result);
    EXPECT_TRUE(error.find("database is locked") != std::string::npos);

    // Clean up database connections before unlinking
    sqlite3_exec(db, "END;", nullptr, nullptr, nullptr);
    sqlite3_close(db);
    buildDB = nullptr;

    ec = llvm::sys::fs::remove(dbPath.str());
    EXPECT_EQ(bool(ec), false);
}